

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testValidDeConvolution3D(void)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  Convolution3DLayerParams *this_01;
  WeightParams *pWVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  int iVar9;
  bool bVar10;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",puVar8);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,1);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,0x20);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,100);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,100);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"probs",puVar8);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m1);
  pNVar5->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_convolution3d(this_00);
  this_01->outputchannels_ = 3;
  this_01->inputchannels_ = 3;
  this_01->ngroups_ = 1;
  this_01->kerneldepth_ = 3;
  this_01->kernelheight_ = 3;
  this_01->kernelwidth_ = 3;
  this_01->stridedepth_ = 1;
  this_01->strideheight_ = 1;
  this_01->stridewidth_ = 1;
  this_01->dilationdepth_ = 1;
  this_01->dilationheight_ = 1;
  this_01->dilationwidth_ = 1;
  this_01->paddingtype_ = 0;
  this_01->custompaddingfront_ = 0;
  this_01->custompaddingback_ = 0;
  this_01->custompaddingtop_ = 0;
  this_01->custompaddingtop_ = 0;
  this_01->custompaddingbottom_ = 0;
  this_01->custompaddingleft_ = 0;
  this_01->custompaddingright_ = 0;
  this_01->hasbias_ = true;
  this_01->isdeconvolution_ = true;
  iVar9 = 0xf3;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    pWVar6 = CoreML::Specification::Convolution3DLayerParams::_internal_mutable_weights(this_01);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar6,1.0);
  }
  iVar9 = 3;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    pWVar6 = CoreML::Specification::Convolution3DLayerParams::_internal_mutable_bias(this_01);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar6,1.0);
  }
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar10 = CoreML::Result::good(&res);
  if (!bVar10) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa96);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)!bVar10;
}

Assistant:

int testValidDeConvolution3D() {
    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);
    params->set_isdeconvolution(true);
    params->set_hasbias(true);

    // Fill weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Fill bias
    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}